

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

CTcLabelFixup * __thiscall CTcCodeStream::alloc_fixup(CTcCodeStream *this)

{
  CTcLabelFixup *pCVar1;
  
  pCVar1 = this->free_fixup_;
  if (pCVar1 != (CTcLabelFixup *)0x0) {
    this->free_fixup_ = pCVar1->nxt;
    return pCVar1;
  }
  pCVar1 = (CTcLabelFixup *)CTcPrsMem::alloc((this->super_CTcDataStream).allocator_,0x18);
  pCVar1->nxt = (CTcLabelFixup *)0x0;
  pCVar1->ofs = 0;
  pCVar1->bias = 0;
  pCVar1->field_0x14 = pCVar1->field_0x14 & 0xfe;
  return pCVar1;
}

Assistant:

CTcLabelFixup *CTcCodeStream::alloc_fixup()
{
    CTcLabelFixup *ret;

    /* if there's anything in the free list, use it */
    if (free_fixup_ != 0)
    {
        /* take the first one off the free list */
        ret = free_fixup_;

        /* unlink it from the list */
        free_fixup_ = free_fixup_->nxt;
    }
    else
    {
        /* allocate a new fixup */
        ret = new (allocator_) CTcLabelFixup;

        /* throw an error if allocation failed */
        if (ret == 0)
            err_throw(TCERR_CODEGEN_NO_MEM);
    }

    /* return the allocated fixup */
    return ret;
}